

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_search.c
# Opt level: O2

DUAL_FILTER_TYPE
find_best_interp_rd_facade
          (MACROBLOCK *x,AV1_COMP *cpi,TileDataEnc *tile_data,BLOCK_SIZE bsize,BUFFER_SET *orig_dst,
          int64_t *rd,RD_STATS *rd_stats_y,RD_STATS *rd_stats,int *switchable_rate,
          BUFFER_SET **dst_bufs,int *switchable_ctx,int skip_pred,uint16_t allow_interp_mask,
          int is_w4_or_h4)

{
  int *in_RAX;
  undefined7 in_register_00000009;
  undefined8 uVar1;
  int filt_type;
  uint uVar2;
  BUFFER_SET **dst_bufs_00;
  undefined2 in_stack_0000003a;
  
  uVar1 = CONCAT71(in_register_00000009,bsize);
  if ((ushort)skip_pred != 0) {
    uVar2 = (uint)switchable_ctx;
    if (_allow_interp_mask != 0) {
      uVar2 = (cpi->interp_search_flags).default_interp_skip_flags;
    }
    dst_bufs_00 = (BUFFER_SET **)0x8;
    while( true ) {
      in_RAX = (int *)(ulong)uVar2;
      uVar2 = (uint)dst_bufs_00;
      if ((int)uVar2 < 0) break;
      if (((ushort)skip_pred >> (uVar2 & 0x1f) & 1) != 0) {
        interpolation_filter_rd
                  (x,cpi,(TileDataEnc *)((ulong)tile_data & 0xff),(BLOCK_SIZE)uVar1,orig_dst,rd,
                   rd_stats_y,rd_stats,switchable_rate,dst_bufs_00,(int)dst_bufs,in_RAX,(int)uVar1);
      }
      dst_bufs_00 = (BUFFER_SET **)(ulong)(uVar2 - 1);
      uVar2 = (uint)switchable_ctx;
    }
  }
  return (DUAL_FILTER_TYPE)in_RAX;
}

Assistant:

static DUAL_FILTER_TYPE find_best_interp_rd_facade(
    MACROBLOCK *const x, const AV1_COMP *const cpi,
    const TileDataEnc *tile_data, BLOCK_SIZE bsize,
    const BUFFER_SET *const orig_dst, int64_t *const rd, RD_STATS *rd_stats_y,
    RD_STATS *rd_stats, int *const switchable_rate,
    const BUFFER_SET *dst_bufs[2], const int switchable_ctx[2],
    const int skip_pred, uint16_t allow_interp_mask, int is_w4_or_h4) {
  int tmp_skip_pred = skip_pred;
  DUAL_FILTER_TYPE best_filt_type = REG_REG;

  // If no filter are set to be evaluated, return from function
  if (allow_interp_mask == 0x0) return best_filt_type;
  // For block width or height is 4, skip the pred evaluation of SHARP_SHARP
  tmp_skip_pred = is_w4_or_h4
                      ? cpi->interp_search_flags.default_interp_skip_flags
                      : skip_pred;

  // Loop over the all filter types and evaluate for only allowed filter types
  for (int filt_type = SHARP_SHARP; filt_type >= REG_REG; --filt_type) {
    const int is_filter_allowed =
        get_interp_filter_allowed_mask(allow_interp_mask, filt_type);
    if (is_filter_allowed)
      if (interpolation_filter_rd(x, cpi, tile_data, bsize, orig_dst, rd,
                                  rd_stats_y, rd_stats, switchable_rate,
                                  dst_bufs, filt_type, switchable_ctx,
                                  tmp_skip_pred))
        best_filt_type = filt_type;
    tmp_skip_pred = skip_pred;
  }
  return best_filt_type;
}